

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

IRNode * __thiscall kratos::SwitchStmt::get_child(SwitchStmt *this,uint64_t index)

{
  pointer ppVar1;
  bool bVar2;
  size_type __n;
  element_type *this_00;
  iterator iVar3;
  iterator iVar4;
  pointer ppVar5;
  reference pvVar6;
  pair<unsigned_long,_kratos::ScopedStmtBlock_*> pVar7;
  unsigned_long local_c0;
  element_type *local_88;
  unsigned_long local_80;
  pair<unsigned_long,_kratos::ScopedStmtBlock_*> local_78;
  reference local_68;
  pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *iter;
  iterator __end2;
  iterator __begin2;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range2;
  undefined1 local_38 [8];
  vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
  cases;
  uint64_t index_local;
  SwitchStmt *this_local;
  
  if (index == 0) {
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)index;
    this_local = (SwitchStmt *)
                 std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(this->target_).
                             super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    cases.
    super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(index - 1);
    std::
    vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::vector((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
              *)local_38);
    __n = std::
          map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
          ::size(&this->body_);
    std::
    vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::reserve((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
               *)local_38,__n);
    __end2 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::begin(&this->body_);
    iter = (pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_> *)
           std::
           map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
           ::end(&this->body_);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&iter);
      if (!bVar2) break;
      local_68 = std::
                 _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
                 ::operator*(&__end2);
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (bVar2) {
        this_00 = std::__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<kratos::Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_68);
        local_c0 = Const::value(this_00);
      }
      else {
        local_c0 = std::numeric_limits<unsigned_long>::max();
      }
      local_80 = local_c0;
      local_88 = std::__shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>::get
                           (&(local_68->second).
                             super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                           );
      pVar7 = std::make_pair<unsigned_long,kratos::ScopedStmtBlock*>(&local_80,&local_88);
      local_78 = pVar7;
      std::
      vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
      ::emplace_back<std::pair<unsigned_long,kratos::ScopedStmtBlock*>>
                ((vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>
                  *)local_38,&local_78);
      std::
      _Rb_tree_iterator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>
      ::operator++(&__end2);
    }
    iVar3 = std::
            vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
            ::begin((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                     *)local_38);
    iVar4 = std::
            vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
            ::end((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                   *)local_38);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,kratos::IRNode*>*,std::vector<std::pair<unsigned_long,kratos::IRNode*>,std::allocator<std::pair<unsigned_long,kratos::IRNode*>>>>,kratos::SwitchStmt::get_child(unsigned_long)::__0>
              (iVar3._M_current,iVar4._M_current);
    ppVar1 = cases.
             super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar5 = (pointer)std::
                      vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                      ::size((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                              *)local_38);
    if (ppVar1 < ppVar5) {
      pvVar6 = std::
               vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
               ::operator[]((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                             *)local_38,
                            (size_type)
                            cases.
                            super__Vector_base<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local = (SwitchStmt *)pvVar6->second;
    }
    else {
      this_local = (SwitchStmt *)0x0;
    }
    std::
    vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
    ::~vector((vector<std::pair<unsigned_long,_kratos::IRNode_*>,_std::allocator<std::pair<unsigned_long,_kratos::IRNode_*>_>_>
               *)local_38);
  }
  return (IRNode *)this_local;
}

Assistant:

IRNode *SwitchStmt::get_child(uint64_t index) {
    if (index == 0) {
        return target_.get();
    } else {
        // need to make it deterministic
        index--;
        std::vector<std::pair<uint64_t, IRNode *>> cases;
        cases.reserve(body_.size());
        for (auto const &iter : body_) {
            cases.emplace_back(std::make_pair(
                iter.first ? iter.first->value() : std::numeric_limits<uint64_t>::max(),
                iter.second.get()));
        }
        std::sort(cases.begin(), cases.end(),
                  [](auto const &a, auto const &b) { return a.first < b.first; });
        if (index < cases.size()) {
            return cases[index].second;
        }
        return nullptr;
    }
}